

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O3

ChQuaternion<double> *
chrono::AngleDT_to_QuatDT
          (ChQuaternion<double> *__return_storage_ptr__,AngleSet angset,ChVector<double> *mangles,
          ChQuaternion<double> *q)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  ChQuaternion<double> local_68;
  ChVector<double> local_48;
  
  Quat_to_Angle((ChVector<double> *)&local_68,angset,q);
  auVar2._8_8_ = 0x3f1a36e2eb1c432d;
  auVar2._0_8_ = 0x3f1a36e2eb1c432d;
  auVar2 = vmulpd_avx512vl(*(undefined1 (*) [16])mangles->m_data,auVar2);
  local_48.m_data[0] = auVar2._0_8_ + local_68.m_data[0];
  local_48.m_data[1] = auVar2._8_8_ + local_68.m_data[1];
  local_48.m_data[2] = mangles->m_data[2] * 0.0001 + local_68.m_data[2];
  Angle_to_Quat(&local_68,angset,&local_48);
  auVar3._8_8_ = local_68.m_data[1];
  auVar3._0_8_ = local_68.m_data[0];
  auVar3._16_8_ = local_68.m_data[2];
  auVar3._24_8_ = local_68.m_data[3];
  auVar3 = vsubpd_avx(auVar3,*(undefined1 (*) [32])q->m_data);
  auVar1._8_8_ = 0x40c3880000000000;
  auVar1._0_8_ = 0x40c3880000000000;
  auVar1._16_8_ = 0x40c3880000000000;
  auVar1._24_8_ = 0x40c3880000000000;
  auVar3 = vmulpd_avx512vl(auVar3,auVar1);
  *(undefined1 (*) [32])__return_storage_ptr__->m_data = auVar3;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> AngleDT_to_QuatDT(AngleSet angset,
                                       const ChVector<double>& mangles,
                                       const ChQuaternion<double>& q) {
    ChQuaternion<double> res;
    ChQuaternion<double> q2;
    ChVector<double> ang1, ang2;

    ang1 = Quat_to_Angle(angset, q);
    ang2 = Vadd(ang1, Vmul(mangles, BDF_STEP_HIGH));
    q2 = Angle_to_Quat(angset, ang2);
    res = Qscale(Qsub(q2, q), 1 / BDF_STEP_HIGH);

    return res;
}